

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_cookies(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  Cookie *co_00;
  char *pcVar1;
  char *local_60;
  Cookie *store;
  Cookie *pCStack_40;
  int count;
  Cookie *co;
  char *addcookies;
  CURLcode result;
  dynbuf *r_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  addcookies._4_4_ = CURLE_OK;
  co = (Cookie *)0x0;
  if (((data->set).str[4] != (char *)0x0) &&
     (pcVar1 = Curl_checkheaders(data,"Cookie"), pcVar1 == (char *)0x0)) {
    co = (Cookie *)(data->set).str[4];
  }
  if ((data->cookies != (CookieInfo *)0x0) || (co != (Cookie *)0x0)) {
    pCStack_40 = (Cookie *)0x0;
    store._4_4_ = 0;
    if ((data->cookies != (CookieInfo *)0x0) &&
       ((*(uint *)&(data->state).field_0x660 >> 0xf & 1) != 0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
      if ((data->state).aptr.cookiehost == (char *)0x0) {
        local_60 = (conn->host).name;
      }
      else {
        local_60 = (data->state).aptr.cookiehost;
      }
      pCStack_40 = Curl_cookie_getlist(data->cookies,local_60,(data->state).up.path,
                                       (conn->handler->protocol & 2) != 0);
      Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
    }
    co_00 = pCStack_40;
    if (pCStack_40 != (Cookie *)0x0) {
      for (; pCStack_40 != (Cookie *)0x0; pCStack_40 = pCStack_40->next) {
        if (pCStack_40->value != (char *)0x0) {
          if ((store._4_4_ == 0) &&
             (addcookies._4_4_ = Curl_dyn_add(r,"Cookie: "), addcookies._4_4_ != CURLE_OK)) break;
          pcVar1 = "";
          if (store._4_4_ != 0) {
            pcVar1 = "; ";
          }
          addcookies._4_4_ = Curl_dyn_addf(r,"%s%s=%s",pcVar1,pCStack_40->name,pCStack_40->value);
          if (addcookies._4_4_ != CURLE_OK) break;
          store._4_4_ = store._4_4_ + 1;
        }
      }
      Curl_cookie_freelist(co_00);
    }
    if ((co != (Cookie *)0x0) && (addcookies._4_4_ == CURLE_OK)) {
      if (store._4_4_ == 0) {
        addcookies._4_4_ = Curl_dyn_add(r,"Cookie: ");
      }
      if (addcookies._4_4_ == CURLE_OK) {
        pcVar1 = "";
        if (store._4_4_ != 0) {
          pcVar1 = "; ";
        }
        addcookies._4_4_ = Curl_dyn_addf(r,"%s%s",pcVar1,co);
        store._4_4_ = store._4_4_ + 1;
      }
    }
    if ((store._4_4_ != 0) && (addcookies._4_4_ == CURLE_OK)) {
      addcookies._4_4_ = Curl_dyn_add(r,"\r\n");
    }
    if (addcookies._4_4_ != CURLE_OK) {
      return addcookies._4_4_;
    }
  }
  return addcookies._4_4_;
}

Assistant:

CURLcode Curl_http_cookies(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  char *addcookies = NULL;
  if(data->set.str[STRING_COOKIE] && !Curl_checkheaders(data, "Cookie"))
    addcookies = data->set.str[STRING_COOKIE];

  if(data->cookies || addcookies) {
    struct Cookie *co = NULL; /* no cookies from start */
    int count = 0;

    if(data->cookies && data->state.cookie_engine) {
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      co = Curl_cookie_getlist(data->cookies,
                               data->state.aptr.cookiehost?
                               data->state.aptr.cookiehost:
                               conn->host.name,
                               data->state.up.path,
                               (conn->handler->protocol&CURLPROTO_HTTPS)?
                               TRUE:FALSE);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    if(co) {
      struct Cookie *store = co;
      /* now loop through all cookies that matched */
      while(co) {
        if(co->value) {
          if(0 == count) {
            result = Curl_dyn_add(r, "Cookie: ");
            if(result)
              break;
          }
          result = Curl_dyn_addf(r, "%s%s=%s", count?"; ":"",
                                 co->name, co->value);
          if(result)
            break;
          count++;
        }
        co = co->next; /* next cookie please */
      }
      Curl_cookie_freelist(store);
    }
    if(addcookies && !result) {
      if(!count)
        result = Curl_dyn_add(r, "Cookie: ");
      if(!result) {
        result = Curl_dyn_addf(r, "%s%s", count?"; ":"", addcookies);
        count++;
      }
    }
    if(count && !result)
      result = Curl_dyn_add(r, "\r\n");

    if(result)
      return result;
  }
  return result;
}